

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int lua_checkstack(lua_State *L,int size)

{
  int in_ESI;
  long in_RDI;
  int res;
  int in_stack_ffffffffffffffec;
  int iVar1;
  
  iVar1 = 1;
  if ((in_ESI < 0x1f41) &&
     ((*(long *)(in_RDI + 0x10) - *(long *)(in_RDI + 0x18) >> 4) + (long)in_ESI < 0x1f41)) {
    if (0 < in_ESI) {
      if (*(long *)(in_RDI + 0x38) - *(long *)(in_RDI + 0x10) <= (long)(in_ESI << 4)) {
        luaD_growstack((lua_State *)CONCAT44(in_ESI,1),in_stack_ffffffffffffffec);
      }
      if (*(ulong *)(*(long *)(in_RDI + 0x28) + 0x10) <
          (ulong)(*(long *)(in_RDI + 0x10) + (long)in_ESI * 0x10)) {
        *(long *)(*(long *)(in_RDI + 0x28) + 0x10) = *(long *)(in_RDI + 0x10) + (long)in_ESI * 0x10;
      }
    }
  }
  else {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int lua_checkstack(lua_State*L,int size){
int res=1;
if(size>8000||(L->top-L->base+size)>8000)
res=0;
else if(size>0){
luaD_checkstack(L,size);
if(L->ci->top<L->top+size)
L->ci->top=L->top+size;
}
return res;
}